

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

StandardPropertyCaseItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StandardPropertyCaseItemSyntax,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>const&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args,
          Token *args_1,PropertyExprSyntax *args_2,Token *args_3)

{
  Token colon;
  Token semi;
  StandardPropertyCaseItemSyntax *this_00;
  
  this_00 = (StandardPropertyCaseItemSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StandardPropertyCaseItemSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (StandardPropertyCaseItemSyntax *)allocateSlow(this,0x68,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  colon.kind = args_1->kind;
  colon._2_1_ = args_1->field_0x2;
  colon.numFlags.raw = (args_1->numFlags).raw;
  colon.rawLen = args_1->rawLen;
  colon.info = args_1->info;
  semi.kind = args_3->kind;
  semi._2_1_ = args_3->field_0x2;
  semi.numFlags.raw = (args_3->numFlags).raw;
  semi.rawLen = args_3->rawLen;
  semi.info = args_3->info;
  slang::syntax::StandardPropertyCaseItemSyntax::StandardPropertyCaseItemSyntax
            (this_00,args,colon,args_2,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }